

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubByteTypes.cpp
# Opt level: O1

vector<MILBlob::UInt4,_std::allocator<MILBlob::UInt4>_> *
MILBlob::UnPackSubByteVecImpl<MILBlob::UInt4>
          (vector<MILBlob::UInt4,_std::allocator<MILBlob::UInt4>_> *__return_storage_ptr__,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *vec,size_t numElements)

{
  long lVar1;
  pointer puVar2;
  pointer puVar3;
  type tVar4;
  invalid_argument *this;
  size_t index;
  double dVar5;
  undefined1 auVar6 [16];
  Span<MILBlob::UInt4,_18446744073709551615UL> subByteSpan;
  Span<MILBlob::UInt4,_18446744073709551615UL> local_30;
  
  std::vector<MILBlob::UInt4,_std::allocator<MILBlob::UInt4>_>::vector
            (__return_storage_ptr__,numElements,(allocator_type *)&local_30);
  puVar2 = (vec->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar3 = (vec->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  lVar1 = numElements * 4;
  auVar6._8_4_ = (int)((ulong)lVar1 >> 0x20);
  auVar6._0_8_ = lVar1;
  auVar6._12_4_ = 0x45300000;
  dVar5 = ceil(((auVar6._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0)) * 0.125);
  if ((long)puVar3 - (long)puVar2 ==
      ((long)(dVar5 - 9.223372036854776e+18) & (long)dVar5 >> 0x3f | (long)dVar5)) {
    if (numElements != 0) {
      index = 0;
      local_30.m_ptr = puVar2;
      local_30.m_size.m_size = numElements;
      do {
        tVar4 = Util::Span<MILBlob::UInt4,_18446744073709551615UL>::ValueAt(&local_30,index);
        (__return_storage_ptr__->super__Vector_base<MILBlob::UInt4,_std::allocator<MILBlob::UInt4>_>
        )._M_impl.super__Vector_impl_data._M_start[index].data = tVar4.data;
        index = index + 1;
      } while (numElements != index);
    }
    return __return_storage_ptr__;
  }
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument
            (this,
             "Unpacking to sub-byte type vector has invalid number of elements. Sub-byte vector with NumElements requires exactly vec.size() bytes."
            );
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

std::vector<T> UnPackSubByteVecImpl(const std::vector<uint8_t>& vec, size_t numElements)
{
    std::vector<T> ret(numElements);
    MILVerifyIsTrue(
        vec.size() == MILBlob::SizeInBytes<T>(numElements),
        std::invalid_argument,
        "Unpacking to sub-byte type vector has invalid number of elements. Sub-byte vector with NumElements "
        "requires exactly vec.size() bytes.");
    Util::Span<T> subByteSpan((typename MILBlob::Util::voidType<T>::type)(vec.data()), numElements);
    for (size_t i = 0; i < numElements; i++) {
        ret[i] = subByteSpan.ValueAt(i);
    }
    return ret;
}